

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoQuad>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoQuad> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZGeoQuad> *cp)

{
  TPZGeoElSideIndex *pTVar1;
  TPZGeoElSideIndex *this_00;
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  int n;
  int i;
  TPZGeoEl *in_stack_ffffffffffffff98;
  TPZGeoMesh *in_stack_ffffffffffffffa0;
  void **in_stack_ffffffffffffffa8;
  pointer_____offset_0x60___ *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoQuad>>(in_RDI,0x21);
  this_01 = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02445af0);
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)this_01,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_024457d8;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_024457d8;
  pzgeom::TPZGeoQuad::TPZGeoQuad
            ((TPZGeoQuad *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (TPZGeoQuad *)in_RDI,(TPZGeoMesh *)this_01);
  pTVar1 = (TPZGeoElSideIndex *)(in_RDI + 0x68);
  this_00 = (TPZGeoElSideIndex *)(in_RDI + 0x140);
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(this_00);
    pTVar1 = pTVar1 + 1;
  } while (pTVar1 != this_00);
  for (local_38 = 0; local_38 < 9; local_38 = local_38 + 1) {
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_38 * 0x18 + 0x68),
               (TPZGeoElSideIndex *)(in_RDX + 0x68 + (long)local_38 * 0x18));
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}